

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

KOption getdetails(Header *h,size_t totalsize,char **fmt,size_t *psize,uint *ntoalign)

{
  KOption KVar1;
  KOption KVar2;
  uint uVar3;
  size_t align;
  size_t local_38;
  
  KVar1 = getoption(h,fmt,psize);
  local_38 = *psize;
  if (KVar1 == Kpaddalign) {
    if (**fmt != '\0') {
      KVar2 = getoption(h,fmt,&local_38);
      if ((KVar2 != Kchar) && (local_38 != 0)) goto LAB_0011a16b;
    }
    luaL_argerror(h->L,1,"invalid next option for option \'X\'");
  }
LAB_0011a16b:
  if (KVar1 == Kchar || local_38 < 2) {
    *ntoalign = 0;
  }
  else {
    if (h->maxalign < local_38) {
      local_38 = (ulong)h->maxalign;
    }
    if ((local_38 & local_38 - 1) == 0) {
      uVar3 = (int)local_38 - 1;
      *ntoalign = (int)local_38 - ((uint)totalsize & uVar3) & uVar3;
    }
    else {
      *ntoalign = 0;
      luaL_argerror(h->L,1,"format asks for alignment not power of 2");
    }
  }
  return KVar1;
}

Assistant:

static KOption getdetails (Header *h, size_t totalsize, const char **fmt,
                           size_t *psize, unsigned *ntoalign) {
  KOption opt = getoption(h, fmt, psize);
  size_t align = *psize;  /* usually, alignment follows size */
  if (opt == Kpaddalign) {  /* 'X' gets alignment from following option */
    if (**fmt == '\0' || getoption(h, fmt, &align) == Kchar || align == 0)
      luaL_argerror(h->L, 1, "invalid next option for option 'X'");
  }
  if (align <= 1 || opt == Kchar)  /* need no alignment? */
    *ntoalign = 0;
  else {
    if (align > h->maxalign)  /* enforce maximum alignment */
      align = h->maxalign;
    if (l_unlikely(!ispow2(align))) {  /* not a power of 2? */
      *ntoalign = 0;  /* to avoid warnings */
      luaL_argerror(h->L, 1, "format asks for alignment not power of 2");
    }
    else {
      /* 'szmoda' = totalsize % align */
      unsigned szmoda = cast_uint(totalsize & (align - 1));
      *ntoalign = cast_uint((align - szmoda) & (align - 1));
    }
  }
  return opt;
}